

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O3

void ycc_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                    JSAMPARRAY output_buf,int num_rows)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  JSAMPLE *pJVar4;
  jpeg_color_deconverter *pjVar5;
  _func_void_j_decompress_ptr *p_Var6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var7;
  _func_void_j_decompress_ptr *p_Var8;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_JSAMPARRAY_int *p_Var9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  JSAMPROW pJVar16;
  uint local_4c;
  JSAMPARRAY local_48;
  
  local_4c = input_row;
  local_48 = output_buf;
  switch(cinfo->out_color_space) {
  case JCS_EXT_RGB:
    if (0 < num_rows) {
      pJVar4 = cinfo->sample_range_limit;
      pjVar5 = cinfo->cconvert;
      p_Var6 = pjVar5[1].start_pass;
      p_Var7 = pjVar5[1].color_convert;
      p_Var8 = pjVar5[2].start_pass;
      p_Var9 = pjVar5[2].color_convert;
      uVar3 = cinfo->output_width;
      do {
        if ((ulong)uVar3 != 0) {
          uVar15 = (ulong)local_4c;
          pJVar10 = (*input_buf)[uVar15];
          pJVar11 = input_buf[1][uVar15];
          pJVar12 = input_buf[2][uVar15];
          pJVar16 = *local_48;
          uVar15 = 0;
          do {
            uVar14 = (ulong)pJVar10[uVar15];
            bVar1 = pJVar11[uVar15];
            bVar2 = pJVar12[uVar15];
            *pJVar16 = pJVar4[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar14];
            pJVar16[1] = pJVar4[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                                   *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) +
                                uVar14];
            pJVar16[2] = pJVar4[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar14];
            pJVar16 = pJVar16 + 3;
            uVar15 = uVar15 + 1;
          } while (uVar3 != uVar15);
        }
        local_4c = local_4c + 1;
        local_48 = local_48 + 1;
        bVar13 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar13);
    }
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    if (0 < num_rows) {
      pJVar4 = cinfo->sample_range_limit;
      pjVar5 = cinfo->cconvert;
      p_Var6 = pjVar5[1].start_pass;
      p_Var7 = pjVar5[1].color_convert;
      p_Var8 = pjVar5[2].start_pass;
      p_Var9 = pjVar5[2].color_convert;
      uVar3 = cinfo->output_width;
      do {
        if ((ulong)uVar3 != 0) {
          uVar15 = (ulong)local_4c;
          pJVar10 = (*input_buf)[uVar15];
          pJVar11 = input_buf[1][uVar15];
          pJVar12 = input_buf[2][uVar15];
          pJVar16 = *local_48;
          uVar15 = 0;
          do {
            uVar14 = (ulong)pJVar10[uVar15];
            bVar1 = pJVar11[uVar15];
            bVar2 = pJVar12[uVar15];
            pJVar16[uVar15 * 4] = pJVar4[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar14];
            pJVar16[uVar15 * 4 + 1] =
                 pJVar4[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                           *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) + uVar14];
            pJVar16[uVar15 * 4 + 2] = pJVar4[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar14];
            pJVar16[uVar15 * 4 + 3] = 0xff;
            uVar15 = uVar15 + 1;
          } while (uVar3 != uVar15);
        }
        local_4c = local_4c + 1;
        local_48 = local_48 + 1;
        bVar13 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar13);
    }
    break;
  case JCS_EXT_BGR:
    if (0 < num_rows) {
      pJVar4 = cinfo->sample_range_limit;
      pjVar5 = cinfo->cconvert;
      p_Var6 = pjVar5[1].start_pass;
      p_Var7 = pjVar5[1].color_convert;
      p_Var8 = pjVar5[2].start_pass;
      p_Var9 = pjVar5[2].color_convert;
      uVar3 = cinfo->output_width;
      do {
        if ((ulong)uVar3 != 0) {
          uVar15 = (ulong)local_4c;
          pJVar10 = (*input_buf)[uVar15];
          pJVar11 = input_buf[1][uVar15];
          pJVar12 = input_buf[2][uVar15];
          pJVar16 = *local_48 + 2;
          uVar15 = 0;
          do {
            uVar14 = (ulong)pJVar10[uVar15];
            bVar1 = pJVar11[uVar15];
            bVar2 = pJVar12[uVar15];
            *pJVar16 = pJVar4[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar14];
            pJVar16[-1] = pJVar4[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                                    *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) +
                                 uVar14];
            pJVar16[-2] = pJVar4[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar14];
            uVar15 = uVar15 + 1;
            pJVar16 = pJVar16 + 3;
          } while (uVar3 != uVar15);
        }
        local_4c = local_4c + 1;
        local_48 = local_48 + 1;
        bVar13 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar13);
    }
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    if (0 < num_rows) {
      pJVar4 = cinfo->sample_range_limit;
      pjVar5 = cinfo->cconvert;
      p_Var6 = pjVar5[1].start_pass;
      p_Var7 = pjVar5[1].color_convert;
      p_Var8 = pjVar5[2].start_pass;
      p_Var9 = pjVar5[2].color_convert;
      uVar3 = cinfo->output_width;
      do {
        if ((ulong)uVar3 != 0) {
          uVar15 = (ulong)local_4c;
          pJVar10 = (*input_buf)[uVar15];
          pJVar11 = input_buf[1][uVar15];
          pJVar12 = input_buf[2][uVar15];
          pJVar16 = *local_48;
          uVar15 = 0;
          do {
            uVar14 = (ulong)pJVar10[uVar15];
            bVar1 = pJVar11[uVar15];
            bVar2 = pJVar12[uVar15];
            pJVar16[uVar15 * 4 + 2] = pJVar4[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar14];
            pJVar16[uVar15 * 4 + 1] =
                 pJVar4[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                           *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) + uVar14];
            pJVar16[uVar15 * 4] = pJVar4[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar14];
            pJVar16[uVar15 * 4 + 3] = 0xff;
            uVar15 = uVar15 + 1;
          } while (uVar3 != uVar15);
        }
        local_4c = local_4c + 1;
        local_48 = local_48 + 1;
        bVar13 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar13);
    }
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    if (0 < num_rows) {
      pJVar4 = cinfo->sample_range_limit;
      pjVar5 = cinfo->cconvert;
      p_Var6 = pjVar5[1].start_pass;
      p_Var7 = pjVar5[1].color_convert;
      p_Var8 = pjVar5[2].start_pass;
      p_Var9 = pjVar5[2].color_convert;
      uVar3 = cinfo->output_width;
      do {
        if ((ulong)uVar3 != 0) {
          uVar15 = (ulong)local_4c;
          pJVar10 = (*input_buf)[uVar15];
          pJVar11 = input_buf[1][uVar15];
          pJVar12 = input_buf[2][uVar15];
          pJVar16 = *local_48;
          uVar15 = 0;
          do {
            uVar14 = (ulong)pJVar10[uVar15];
            bVar1 = pJVar11[uVar15];
            bVar2 = pJVar12[uVar15];
            pJVar16[uVar15 * 4 + 3] = pJVar4[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar14];
            pJVar16[uVar15 * 4 + 2] =
                 pJVar4[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                           *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) + uVar14];
            pJVar16[uVar15 * 4 + 1] = pJVar4[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar14];
            pJVar16[uVar15 * 4] = 0xff;
            uVar15 = uVar15 + 1;
          } while (uVar3 != uVar15);
        }
        local_4c = local_4c + 1;
        local_48 = local_48 + 1;
        bVar13 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar13);
    }
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    if (0 < num_rows) {
      pJVar4 = cinfo->sample_range_limit;
      pjVar5 = cinfo->cconvert;
      p_Var6 = pjVar5[1].start_pass;
      p_Var7 = pjVar5[1].color_convert;
      p_Var8 = pjVar5[2].start_pass;
      p_Var9 = pjVar5[2].color_convert;
      uVar3 = cinfo->output_width;
      do {
        if ((ulong)uVar3 != 0) {
          uVar15 = (ulong)local_4c;
          pJVar10 = (*input_buf)[uVar15];
          pJVar11 = input_buf[1][uVar15];
          pJVar12 = input_buf[2][uVar15];
          pJVar16 = *local_48;
          uVar15 = 0;
          do {
            uVar14 = (ulong)pJVar10[uVar15];
            bVar1 = pJVar11[uVar15];
            bVar2 = pJVar12[uVar15];
            pJVar16[uVar15 * 4 + 1] = pJVar4[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar14];
            pJVar16[uVar15 * 4 + 2] =
                 pJVar4[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                           *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) + uVar14];
            pJVar16[uVar15 * 4 + 3] = pJVar4[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar14];
            pJVar16[uVar15 * 4] = 0xff;
            uVar15 = uVar15 + 1;
          } while (uVar3 != uVar15);
        }
        local_4c = local_4c + 1;
        local_48 = local_48 + 1;
        bVar13 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar13);
    }
    break;
  default:
    if (0 < num_rows) {
      pJVar4 = cinfo->sample_range_limit;
      pjVar5 = cinfo->cconvert;
      p_Var6 = pjVar5[1].start_pass;
      p_Var7 = pjVar5[1].color_convert;
      p_Var8 = pjVar5[2].start_pass;
      p_Var9 = pjVar5[2].color_convert;
      uVar3 = cinfo->output_width;
      do {
        if ((ulong)uVar3 != 0) {
          uVar15 = (ulong)local_4c;
          pJVar10 = (*input_buf)[uVar15];
          pJVar11 = input_buf[1][uVar15];
          pJVar12 = input_buf[2][uVar15];
          pJVar16 = *local_48;
          uVar15 = 0;
          do {
            uVar14 = (ulong)pJVar10[uVar15];
            bVar1 = pJVar11[uVar15];
            bVar2 = pJVar12[uVar15];
            *pJVar16 = pJVar4[(long)*(int *)(p_Var6 + (ulong)bVar2 * 4) + uVar14];
            pJVar16[1] = pJVar4[(long)(int)((ulong)(*(long *)(p_Var8 + (ulong)bVar2 * 8) +
                                                   *(long *)(p_Var9 + (ulong)bVar1 * 8)) >> 0x10) +
                                uVar14];
            pJVar16[2] = pJVar4[(long)*(int *)(p_Var7 + (ulong)bVar1 * 4) + uVar14];
            pJVar16 = pJVar16 + 3;
            uVar15 = uVar15 + 1;
          } while (uVar3 != uVar15);
        }
        local_4c = local_4c + 1;
        local_48 = local_48 + 1;
        bVar13 = 1 < num_rows;
        num_rows = num_rows + -1;
      } while (bVar13);
    }
  }
  return;
}

Assistant:

METHODDEF(void)
ycc_rgb_convert(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                JDIMENSION input_row, JSAMPARRAY output_buf, int num_rows)
{
  switch (cinfo->out_color_space) {
  case JCS_EXT_RGB:
    ycc_extrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                num_rows);
    break;
  case JCS_EXT_RGBX:
  case JCS_EXT_RGBA:
    ycc_extrgbx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_BGR:
    ycc_extbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                num_rows);
    break;
  case JCS_EXT_BGRX:
  case JCS_EXT_BGRA:
    ycc_extbgrx_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_XBGR:
  case JCS_EXT_ABGR:
    ycc_extxbgr_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  case JCS_EXT_XRGB:
  case JCS_EXT_ARGB:
    ycc_extxrgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                                 num_rows);
    break;
  default:
    ycc_rgb_convert_internal(cinfo, input_buf, input_row, output_buf,
                             num_rows);
    break;
  }
}